

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O3

void __thiscall
Fade::run(Fade *this,FadeAggregates *finalAggregates,
         vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
         *aggregateRegister,int *numberOfAggregatesPerNode,int *degreeOfLocalAggregates,
         bool *_onehotfeatures,bool *isDetermined,int *determinedBy)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  Database pTVar5;
  FadeAttributes *pFVar6;
  double *pdVar7;
  map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
  *pmVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  int iVar12;
  uint uVar13;
  int *piVar14;
  int **ppiVar15;
  DTreeNode *pDVar16;
  ulong *puVar17;
  pointer pdVar18;
  int *piVar19;
  pointer *pppdVar20;
  int *__dest;
  DataType *__s;
  ulong *puVar21;
  _Base_ptr p_Var22;
  ostream *poVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  pointer pvVar28;
  bool bVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  _Rb_tree_header *p_Var35;
  long lVar36;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>,_bool>
  pVar37;
  vector<int_*,_std::allocator<int_*>_> offs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aggs;
  allocator_type local_81;
  ulong local_80;
  ulong local_78;
  long local_70;
  vector<int_*,_std::allocator<int_*>_> local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_50;
  int *local_38;
  
  local_70 = (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _root->_id;
  this->_numberOfAggregatesPerNode = numberOfAggregatesPerNode;
  this->_degreeOfLocalAggregates = degreeOfLocalAggregates;
  this->_onehotfeatures = _onehotfeatures;
  this->isDetermined = isDetermined;
  this->determinedBy = determinedBy;
  uVar33 = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar25 = ((long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 3 + -1] +
           (long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 4 + -1]) * 4;
  if ((int)((long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 3 + -1] +
           (long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 4 + -1]) < 0) {
    uVar25 = 0xffffffffffffffff;
  }
  local_38 = numberOfAggregatesPerNode;
  piVar14 = (int *)operator_new__(uVar25);
  this->_degreeOfCategoricalAggregateGroup = piVar14;
  this->_numberOfValues = 0;
  ppiVar15 = (int **)operator_new__(-(ulong)(uVar33 >> 0x3d != 0) | uVar33 * 8);
  this->_aggregateRegister = ppiVar15;
  if (uVar33 != 0) {
    uVar33 = 0;
    do {
      pDVar16 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)uVar33);
      uVar32 = dfdb::params::NUM_OF_ATTRIBUTES;
      iVar1 = pDVar16->_numOfChildren;
      local_80 = CONCAT44(local_80._4_4_,iVar1 + 2);
      local_78 = CONCAT44(local_78._4_4_,iVar1 + 3);
      iVar12 = (this->_numberOfAggregatesPerNode + uVar33)[dfdb::params::NUM_OF_ATTRIBUTES * 2] *
               (iVar1 + 3) + this->_numberOfAggregatesPerNode[uVar33] * (iVar1 + 2);
      uVar25 = (long)iVar12 * 4;
      if (iVar12 < 0) {
        uVar25 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar25);
      this->_aggregateRegister[uVar33] = piVar14;
      piVar14 = this->_numberOfAggregatesPerNode;
      piVar19 = this->_aggregateRegister[uVar33];
      pvVar28 = (aggregateRegister->
                super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar25 = (ulong)(uint)piVar14[uVar33];
      lVar31 = 0;
      iVar12 = 0;
      bVar11 = true;
      do {
        bVar29 = bVar11;
        if (0 < (int)uVar25) {
          lVar30 = *(long *)&pvVar28[uVar33].super__Vector_base<int_*,_std::allocator<int_*>_>.
                             _M_impl.super__Vector_impl_data;
          lVar34 = 0;
          do {
            piVar19[iVar12 + lVar34] = *(int *)(*(long *)(lVar30 + lVar34 * 8) + lVar31 * 4);
            lVar34 = lVar34 + 1;
            uVar25 = (ulong)piVar14[uVar33];
          } while (lVar34 < (long)uVar25);
          iVar12 = iVar12 + (int)lVar34;
        }
        lVar31 = 1;
        bVar11 = false;
      } while (bVar29);
      pvVar28 = (aggregateRegister->
                super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)uVar25) {
        lVar31 = 0;
        do {
          if (0 < iVar1) {
            lVar30 = *(long *)(*(long *)&pvVar28[uVar33].
                                         super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                         super__Vector_impl_data + lVar31 * 8);
            lVar34 = 0;
            do {
              piVar19[iVar12 + lVar34] = *(int *)(lVar30 + 8 + lVar34 * 4);
              lVar34 = lVar34 + 1;
            } while ((local_80 & 0xffffffff) - 2 != lVar34);
            iVar12 = iVar12 + (int)lVar34;
            uVar25 = (ulong)(uint)piVar14[uVar33];
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < (int)uVar25);
        pvVar28 = (aggregateRegister->
                  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      iVar24 = local_38[uVar32 * 2 + uVar33];
      lVar31 = 0;
      bVar11 = true;
      do {
        bVar29 = bVar11;
        if (0 < iVar24) {
          lVar30 = *(long *)&pvVar28[uVar33].super__Vector_base<int_*,_std::allocator<int_*>_>.
                             _M_impl.super__Vector_impl_data;
          lVar34 = 0;
          do {
            piVar19[iVar12 + lVar34] =
                 *(int *)(*(long *)(lVar30 + (piVar14[uVar33] + lVar34) * 8) + lVar31 * 4);
            iVar24 = local_38[uVar32 * 2 + uVar33];
            lVar34 = lVar34 + 1;
          } while ((int)lVar34 < iVar24);
          iVar12 = iVar12 + (int)lVar34;
        }
        lVar31 = 1;
        bVar11 = false;
      } while (bVar29);
      iVar24 = piVar14[uVar32 * 2 + uVar33];
      if (0 < iVar24) {
        pvVar28 = (aggregateRegister->
                  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar27 = 0;
        do {
          if (-1 < iVar1) {
            lVar31 = *(long *)&pvVar28[uVar33].super__Vector_base<int_*,_std::allocator<int_*>_>.
                               _M_impl.super__Vector_impl_data;
            lVar30 = 0;
            do {
              piVar19[iVar12 + lVar30] =
                   *(int *)(*(long *)(lVar31 + ((long)iVar27 + (long)piVar14[uVar33]) * 8) + 8 +
                           lVar30 * 4);
              lVar30 = lVar30 + 1;
            } while ((local_78 & 0xffffffff) - 2 != lVar30);
            iVar12 = iVar12 + (int)lVar30;
            iVar24 = piVar14[uVar32 * 2 + uVar33];
          }
          iVar27 = iVar27 + 1;
        } while (iVar27 < iVar24);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < uVar32);
    uVar13 = (int)uVar32 - 1;
    if (-1 < (int)uVar13) {
      uVar33 = (ulong)uVar13;
      do {
        uVar25 = uVar33;
        pDVar16 = DTree::getNode((this->_dTree).
                                 super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                 (int)uVar25);
        uVar13 = pDVar16->_numOfChildren;
        pDVar16 = DTree::getNode((this->_dTree).
                                 super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                 (int)uVar25);
        uVar33 = dfdb::params::NUM_OF_ATTRIBUTES;
        piVar14 = this->_numberOfAggregatesPerNode;
        iVar1 = piVar14[dfdb::params::NUM_OF_ATTRIBUTES * 2 + uVar25];
        if (0 < (long)iVar1) {
          piVar19 = pDVar16->_childrenIDs;
          local_78 = (ulong)piVar14[uVar25];
          iVar12 = piVar14[dfdb::params::NUM_OF_ATTRIBUTES * 3 + uVar25];
          lVar31 = *(long *)&(aggregateRegister->
                             super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar25].
                             super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                             super__Vector_impl_data;
          piVar4 = this->_degreeOfCategoricalAggregateGroup;
          lVar30 = 0;
          do {
            if ((int)uVar13 < 1) {
              iVar24 = 0;
            }
            else {
              uVar32 = 0;
              iVar24 = 0;
              do {
                iVar27 = *(int *)(*(long *)(lVar31 + (lVar30 + local_78) * 8) + 8 + uVar32 * 4);
                if (piVar14[piVar19[uVar32]] <= iVar27) {
                  iVar24 = iVar24 + this->_degreeOfCategoricalAggregateGroup
                                    [(iVar27 - piVar14[piVar19[uVar32]]) +
                                     piVar14[uVar33 * 3 + (long)piVar19[uVar32]]];
                }
                uVar32 = uVar32 + 1;
              } while (uVar13 != uVar32);
            }
            piVar4[iVar12 + lVar30] =
                 (uint)(*(int *)(*(long *)(lVar31 + (lVar30 + local_78) * 8) + 8 +
                                (long)(int)uVar13 * 4) == 1) + iVar24;
            lVar30 = lVar30 + 1;
          } while (lVar30 != iVar1);
        }
        uVar33 = uVar25 - 1;
        local_80 = uVar25;
      } while (0 < (long)uVar25);
    }
  }
  uVar33 = dfdb::params::NUM_OF_TABLES;
  uVar25 = (ulong)this->_numOfThreads;
  if (uVar25 < 2) {
    uVar25 = -(ulong)(dfdb::params::NUM_OF_TABLES >> 0x3e != 0) | dfdb::params::NUM_OF_TABLES * 4;
    piVar14 = (int *)operator_new__(uVar25);
    piVar19 = (int *)operator_new__(uVar25);
    if (uVar33 != 0) {
      pppdVar20 = &(this->_data->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
      uVar25 = 0;
      do {
        piVar14[uVar25] = 0;
        piVar19[uVar25] =
             (int)((ulong)((long)*pppdVar20 -
                          (long)((_Vector_impl_data *)(pppdVar20 + -1))->_M_start) >> 3) + -1;
        uVar25 = uVar25 + 1;
        pppdVar20 = pppdVar20 + 3;
      } while (uVar33 != uVar25);
    }
    runAggregator(this,piVar14,piVar19,0);
    lVar31 = local_70;
    std::vector<double,_std::allocator<double>_>::operator=
              (&finalAggregates->categoricalAggregates,
               this->_aggregatesPerPartition->categoricalAggregates + local_70);
    uVar33 = dfdb::params::NUM_OF_ATTRIBUTES;
    piVar4 = this->_numberOfAggregatesPerNode;
    lVar30 = (long)piVar4[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar31];
    if (0 < lVar30) {
      uVar25 = lVar30 << 2;
      __dest = (int *)operator_new__(uVar25);
      finalAggregates->categoricalOffsets = __dest;
      memcpy(__dest,this->_aggregatesPerPartition->categoricalOffsets + piVar4[uVar33 * 3 + lVar31],
             uVar25);
    }
    operator_delete__(piVar14);
    operator_delete__(piVar19);
  }
  else {
    puVar17 = (ulong *)operator_new__(uVar25 * 8 + 8);
    *puVar17 = uVar25;
    puVar21 = puVar17 + 1;
    memset(puVar21,0,uVar25 * 8);
    pdVar18 = (pointer)getTableToPartition(this);
    if (this->_numOfThreads != 0) {
      pTVar5 = this->_data;
      uVar33 = 0;
      do {
        local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
        ((local_50.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&PTR___State_00143ca8;
        ((local_50.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)this;
        ((local_50.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)pTVar5;
        local_50.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = pdVar18;
        std::thread::_M_start_thread(&local_68,&local_50,0);
        if (local_50.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)((local_50.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[1])();
        }
        if (puVar21[uVar33] != 0) goto LAB_0012d15a;
        puVar21[uVar33] =
             (ulong)local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        uVar33 = uVar33 + 1;
      } while (uVar33 < this->_numOfThreads);
      if (this->_numOfThreads != 0) {
        uVar33 = 0;
        do {
          std::thread::join();
          uVar33 = uVar33 + 1;
        } while (uVar33 < this->_numOfThreads);
      }
    }
    lVar30 = local_70;
    if (*puVar17 != 0) {
      lVar31 = *puVar17 << 3;
      do {
        if (*(long *)((long)puVar17 + lVar31) != 0) {
LAB_0012d15a:
          std::terminate();
        }
        lVar31 = lVar31 + -8;
      } while (lVar31 != 0);
    }
    operator_delete__(puVar17);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_50,(ulong)this->_numOfPartitions,(allocator_type *)&local_68);
    std::vector<int_*,_std::allocator<int_*>_>::vector
              (&local_68,(ulong)this->_numOfPartitions,&local_81);
    lVar31 = lVar30;
    if (this->_numOfPartitions != 0) {
      lVar34 = 0;
      lVar36 = 0;
      uVar33 = 0;
      do {
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((local_50.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar34),
                   (vector<double,_std::allocator<double>_> *)
                   (*(long *)((long)&this->_aggregatesPerPartition->categoricalAggregates + lVar36)
                   + lVar30 * 0x18));
        local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar33] =
             *(int **)((long)&this->_aggregatesPerPartition->categoricalOffsets + lVar36);
        uVar33 = uVar33 + 1;
        lVar36 = lVar36 + 0x88;
        lVar34 = lVar34 + 0x18;
        lVar31 = local_70;
      } while (uVar33 < this->_numOfPartitions);
    }
    uVar33 = 0xffffffffffffffff;
    if (-1 < (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar31]) {
      uVar33 = (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar31]
               * 4;
    }
    piVar14 = (int *)operator_new__(uVar33);
    finalAggregates->categoricalOffsets = piVar14;
    mergeCategoricalValues(this,&finalAggregates->categoricalAggregates,piVar14,&local_50,&local_68)
    ;
    if (local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_50);
  }
  uVar25 = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar13 = (this->_numberOfAggregatesPerNode + lVar31)[dfdb::params::NUM_OF_ATTRIBUTES];
  uVar2 = this->_numOfPartitions;
  uVar3 = this->_numberOfAggregatesPerNode[lVar31];
  uVar33 = (long)(int)uVar3 * 8;
  if ((long)(int)uVar3 < 0) {
    uVar33 = 0xffffffffffffffff;
  }
  __s = (DataType *)operator_new__(uVar33);
  memset(__s,0,uVar33);
  if ((ulong)uVar2 != 0) {
    pFVar6 = this->_aggregatesPerPartition;
    uVar33 = 0;
    do {
      if (0 < (int)uVar3) {
        pdVar7 = pFVar6[uVar33].aggregates;
        uVar32 = 0;
        do {
          __s[uVar32] = pdVar7[(long)(int)uVar13 + uVar32] + __s[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar3 != uVar32);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar2);
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar25;
  finalAggregates->aggregates = __s;
  uVar33 = 0xffffffffffffffff;
  if (SUB168(auVar9 * ZEXT816(0x30),8) == 0) {
    uVar33 = SUB168(auVar9 * ZEXT816(0x30),0) | 8;
  }
  puVar21 = (ulong *)operator_new__(uVar33);
  *puVar21 = uVar25;
  if (uVar25 != 0) {
    puVar17 = puVar21 + 2;
    lVar31 = uVar25 * 0x30;
    do {
      *(undefined4 *)puVar17 = 0;
      puVar17[1] = 0;
      puVar17[2] = (ulong)puVar17;
      puVar17[3] = (ulong)puVar17;
      puVar17[4] = 0;
      puVar17 = puVar17 + 6;
      lVar31 = lVar31 + -0x30;
    } while (lVar31 != 0);
  }
  finalAggregates->functionalDependencies =
       (map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
        *)(puVar21 + 1);
  iVar1 = determinedBy[uVar25];
  uVar32 = (ulong)iVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar32;
  uVar33 = 0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0x30),8) == 0) {
    uVar33 = SUB168(auVar10 * ZEXT816(0x30),0) | 8;
  }
  puVar21 = (ulong *)operator_new__(uVar33);
  *puVar21 = uVar32;
  if (uVar32 == 0) {
    finalAggregates->determinantValueSet =
         (set<double,_std::less<double>,_std::allocator<double>_> *)(puVar21 + 1);
  }
  else {
    puVar17 = puVar21 + 2;
    lVar31 = uVar32 * 0x30;
    do {
      *(undefined4 *)puVar17 = 0;
      puVar17[1] = 0;
      puVar17[2] = (ulong)puVar17;
      puVar17[3] = (ulong)puVar17;
      puVar17[4] = 0;
      puVar17 = puVar17 + 6;
      lVar31 = lVar31 + -0x30;
    } while (lVar31 != 0);
    finalAggregates->determinantValueSet =
         (set<double,_std::less<double>,_std::allocator<double>_> *)(puVar21 + 1);
    uVar13 = this->_numOfPartitions;
    if (uVar13 != 0 && 0 < iVar1) {
      uVar33 = 0;
      uVar32 = uVar25;
      do {
        if (uVar25 == 0) {
          uVar25 = 0;
        }
        else {
          uVar26 = 0;
          uVar25 = uVar32;
          local_80 = uVar33;
          do {
            uVar32 = uVar26;
            if (isDetermined[uVar26] == true) {
              pmVar8 = this->_aggregatesPerPartition[uVar33].functionalDependencies;
              p_Var35 = &pmVar8[uVar26]._M_t._M_impl.super__Rb_tree_header;
              p_Var22 = pmVar8[uVar26]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if ((_Rb_tree_header *)p_Var22 != p_Var35) {
                iVar1 = determinedBy[uVar26];
                local_78 = uVar26;
                do {
                  std::
                  _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<double>>
                            ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                              *)(finalAggregates->determinantValueSet + determinedBy[iVar1]),
                             *(_Base_ptr *)(p_Var22 + 2),
                             (_Rb_tree_const_iterator<double>)&p_Var22[1]._M_left);
                  pVar37 = std::
                           _Rb_tree<double,std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>,std::_Select1st<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>,std::less<double>,std::allocator<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>>
                           ::
                           _M_emplace_unique<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>&>
                                     ((_Rb_tree<double,std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>,std::_Select1st<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>,std::less<double>,std::allocator<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>>
                                       *)(finalAggregates->functionalDependencies + uVar26),
                                      (pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                                       *)(p_Var22 + 1));
                  if (((undefined1  [16])pVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                    std::
                    _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<double>>
                              ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                                *)&pVar37.first._M_node._M_node[1]._M_parent,
                               *(_Base_ptr *)(p_Var22 + 2),
                               (_Rb_tree_const_iterator<double>)&p_Var22[1]._M_left);
                  }
                  p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
                  uVar32 = local_78;
                  uVar25 = dfdb::params::NUM_OF_ATTRIBUTES;
                } while ((_Rb_tree_header *)p_Var22 != p_Var35);
              }
            }
            uVar26 = uVar32 + 1;
          } while (uVar26 < uVar25);
          uVar13 = this->_numOfPartitions;
          uVar33 = local_80;
          uVar32 = uVar25;
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 < uVar13);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DATA - Number of values in Factorised Representation: ",0x36);
  poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DATA - Number of values in Listing Representation: ",0x33);
  poVar23 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DATA - Compression Factor: ",0x1b);
  poVar23 = std::ostream::_M_insert<double>
                      (((((double)CONCAT44(0x45300000,(int)(dfdb::params::NUM_OF_ATTRIBUTES >> 0x20)
                                          ) - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)dfdb::params::NUM_OF_ATTRIBUTES) -
                        4503599627370496.0)) * *finalAggregates->aggregates) /
                       (double)this->_numberOfValues);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
  std::ostream::put((char)poVar23);
  std::ostream::flush();
  return;
}

Assistant:

void Fade::run(
    FadeAggregates& finalAggregates, std::vector<std::vector<int*> >& aggregateRegister,
    int* numberOfAggregatesPerNode, int* degreeOfLocalAggregates, bool* _onehotfeatures,
    bool* isDetermined, int* determinedBy)
{
    int rootID = _dTree->_root->_id;
    
    _numberOfAggregatesPerNode = numberOfAggregatesPerNode;
    _degreeOfLocalAggregates = degreeOfLocalAggregates;

    this->_onehotfeatures = _onehotfeatures;
    this->isDetermined = isDetermined; 
    this->determinedBy = determinedBy; 

    _degreeOfCategoricalAggregateGroup =
        new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 4 - 1] +
                _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 - 1]];
    
    _numberOfValues = 0;
    
    /*
     * _aggregateRegister is used as a performance improvement for better
     * accessing of aggregateInfoPerNode
     */
    _aggregateRegister = new int*[NUM_OF_ATTRIBUTES];

    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES; ++attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;

        int totalNumberOfAggregates =
            _numberOfAggregatesPerNode[attID] * (childCount + 2) +
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID] *
            (childCount + 3);

        _aggregateRegister[attID] = new int[totalNumberOfAggregates];

        int *info = _aggregateRegister[attID];
        int index = 0;

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
        {
            for (int j = 2; j < childCount + 2; ++j)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i <
                     numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }

        for (int i = 0; i <
                 _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
        {
            for (int j = 2; j < childCount + 3; ++j)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }
    }

        
    for (int attID = NUM_OF_ATTRIBUTES - 1; attID >= 0; --attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;
        int *childIDs = _dTree->getNode(attID)->_childrenIDs;
        int catAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID];

        int numberOfContAggregates = _numberOfAggregatesPerNode[attID];
        int numberOfCatAggregates =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES*2 + attID];

        for (int catAggNo = 0; catAggNo < numberOfCatAggregates; ++catAggNo)
        {
            int numCatParts = 0;
            for (int child = 0; child < childCount; ++child)
            {
                if (aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] >=
                    _numberOfAggregatesPerNode[childIDs[child]])
                {

                    numCatParts +=
                        _degreeOfCategoricalAggregateGroup[
                            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + childIDs[child]] +
                            aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] -
                            _numberOfAggregatesPerNode[childIDs[child]]];
                }
            }

            if (aggregateRegister[attID][numberOfContAggregates + catAggNo][childCount + 2] == 1)
                numCatParts += 1;

            _degreeOfCategoricalAggregateGroup[catAggOffset + catAggNo] = numCatParts;
        }
    }
    
    /* Spawn threads and do partitioning. */
    if (_numOfThreads > 1)
    {
        /* Array containing threads to run F on different partitions. */
        thread* fWorkers = new thread[_numOfThreads];

        /* Table to partition (only one table is partitioned to guarantee join
         * correctness). */
        size_t tableToPartition = getTableToPartition();

        DINFO(
            "INFO - engine: launching " + to_string(_numOfThreads)
            + " threads to process " + to_string(_numOfPartitions)
            + " partitions on table " + to_string(tableToPartition)
            + ".\n");

        /* This is needed for the lambda expression below - does not accept a
         * variable that is out of scope. */
        Database dataToProcess = _data;
        
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker] =
                thread(
                    [this, dataToProcess, tableToPartition]()
                    {
                        /* Current partition to work on; increase value for next
                         * thread to fetch. */
                        unsigned int currentPartition =
                        _nextPartition.fetch_add(1, memory_order_relaxed);

                        /* Iterate while not all the partitions were processed. */
                        while (currentPartition < _numOfPartitions)
                        {
                            /* Set bounds for the different tables. */
                            int* lowerBounds = new int[NUM_OF_TABLES];
                            int* upperBounds = new int[NUM_OF_TABLES];
                            for (size_t table = 0; table < NUM_OF_TABLES; ++table)
                            {
                                /* This is not a table to partition; it will be
                                 * fully processed. */
                                if(table != tableToPartition)
                                {
                                    lowerBounds[table] = 0;
                                    upperBounds[table] = _data[table].size() - 1;
                                }
                                /* Table to partition; define bounds based on
                                 * current partition number. */
                                else
                                {
                                    lowerBounds[table] = (int)(_data[table].size() * ((double) currentPartition/_numOfPartitions));
                                    upperBounds[table] = (int)(_data[table].size() * ((double) (currentPartition+1)/_numOfPartitions)) - 1;
                                }

                            }


                            /* Launch Fade to compute Aggregates. */
                            runAggregator(lowerBounds, upperBounds, currentPartition);

                            /* Retrieve and increase value of current partition
                             * to work on. */
                            currentPartition = _nextPartition.fetch_add(1, memory_order_relaxed);

                            /* Clean up bound arrays. */
                            delete[] lowerBounds;
                            delete[] upperBounds;
                        }
                    });
        }

        /* Wait for all threads to finish their tasks. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker].join();
        }

        /* Delete array of threads. */
        delete[] fWorkers;

        vector<vector<double> > aggs(_numOfPartitions);
        vector<int*> offs(_numOfPartitions);
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            aggs[partition] = _aggregatesPerPartition[partition].categoricalAggregates[rootID];			
            offs[partition] = _aggregatesPerPartition[partition].categoricalOffsets;
        }

        finalAggregates.categoricalOffsets =
            new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID]];
        
        mergeCategoricalValues(finalAggregates.categoricalAggregates,
                               finalAggregates.categoricalOffsets, aggs, offs);
    }
    else
    {
        /* Set bounds for the different tables: they cover the whole tables */
        int* lowerBounds = new int[NUM_OF_TABLES];
        int* upperBounds = new int[NUM_OF_TABLES];
        for (size_t table = 0; table < NUM_OF_TABLES; ++table)
        {
            lowerBounds[table] = 0;
            upperBounds[table] = _data[table].size() - 1;
        }

        /* Launch Fade to compute Aggregates. */
        runAggregator(lowerBounds, upperBounds, 0);

        /* Retrieving the final categorical aggregates. */
        finalAggregates.categoricalAggregates =
            _aggregatesPerPartition[0].categoricalAggregates[rootID];

        /* Retrieving the final number of categorical aggregate groups. */
        int numCatAggs = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];

        /* Retrieving the final offsets for each categorical aggregate group. */
        if (numCatAggs > 0)
        {
            finalAggregates.categoricalOffsets = new int[numCatAggs];
            memcpy(finalAggregates.categoricalOffsets,
                   &_aggregatesPerPartition[0].categoricalOffsets[
                       _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID]],
                   sizeof(int) * numCatAggs);
        }

        /* Clean up bound arrays. */
        delete[] lowerBounds;
        delete[] upperBounds;
    }

    int aggregateOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + rootID];

    double numOfTuples = 0.0; 
    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        numOfTuples += _aggregatesPerPartition[partition].aggregates[0];
    }

    /* Retrieve the aggregates from all the partitions and sum them up. */
    double* finalContinuousAggregates =
        new double[_numberOfAggregatesPerNode[rootID]]();

    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        for (int aggregateNo = 0; aggregateNo <
                 _numberOfAggregatesPerNode[rootID]; ++aggregateNo)
            finalContinuousAggregates[aggregateNo] +=
                _aggregatesPerPartition[partition].aggregates[aggregateOffset + aggregateNo];
    }

    finalAggregates.aggregates = finalContinuousAggregates;


    finalAggregates.functionalDependencies = new map<double, set<double>>[NUM_OF_ATTRIBUTES];

    int numOfFDs = determinedBy[NUM_OF_ATTRIBUTES];
    finalAggregates.determinantValueSet = new set<double>[numOfFDs];

    if(numOfFDs > 0)
    {
        /* We combine the FDs from different partitions & collect the set of determinant values. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
            {
                if (isDetermined[i])
                {
                    int determinantID = determinedBy[i];
                    for (auto& p : _aggregatesPerPartition[partition].functionalDependencies[i])
                    {
                        finalAggregates.determinantValueSet[determinedBy[determinantID]].insert(p.second.begin(), p.second.end());

                        auto insertPair = finalAggregates.functionalDependencies[i].insert(p);
                        if (!insertPair.second)
                            insertPair.first->second.insert(p.second.begin(), p.second.end());
                    }
                }
            }
        }
    }

    std::cout << "DATA - Number of values in Factorised Representation: " << _numberOfValues << "\n";
    std::cout << "DATA - Number of values in Listing Representation: " <<
        long(finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) << std::endl;
    std::cout << std::fixed << "DATA - Compression Factor: "
              << (finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) / _numberOfValues
              << std::endl;   
}